

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

Llb_Grp_t * Llb_ManGroupCreateFromCuts(Llb_Man_t *pMan,Vec_Int_t *vCut1,Vec_Int_t *vCut2)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  int *piVar4;
  int iVar5;
  Llb_Grp_t *pGroup;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  void *pvVar8;
  Aig_Obj_t *pObj;
  long lVar9;
  
  pGroup = Llb_ManGroupAlloc(pMan);
  Aig_ManIncrementTravId(pMan->pAig);
  iVar5 = vCut1->nSize;
  if (0 < (long)iVar5) {
    pAVar3 = pMan->pAig;
    piVar4 = vCut1->pArray;
    pVVar7 = pAVar3->vObjs;
    lVar9 = 0;
    do {
      iVar1 = piVar4[lVar9];
      if (((long)iVar1 < 0) || (pVVar7->nSize <= iVar1)) goto LAB_00931096;
      *(int *)((long)pVVar7->pArray[iVar1] + 0x20) = pAVar3->nTravIds;
      lVar9 = lVar9 + 1;
    } while (iVar5 != lVar9);
  }
  iVar5 = vCut2->nSize;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      pVVar7 = pMan->pAig->vObjs;
      if (pVVar7 == (Vec_Ptr_t *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        uVar2 = vCut2->pArray[lVar9];
        if (((int)uVar2 < 0) || (pVVar7->nSize <= (int)uVar2)) goto LAB_00931096;
        pvVar8 = pVVar7->pArray[uVar2];
      }
      if (*(int *)((long)pvVar8 + 0x20) != pMan->pAig->nTravIds) {
        pVVar7 = pGroup->vOuts;
        uVar2 = pVVar7->nSize;
        if (uVar2 == pVVar7->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = 0x10;
          }
          else {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar6 = pVVar7->pArray;
        }
        iVar5 = pVVar7->nSize;
        pVVar7->nSize = iVar5 + 1;
        ppvVar6[iVar5] = pvVar8;
        iVar5 = vCut2->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  Aig_ManIncrementTravId(pMan->pAig);
  if (0 < vCut2->nSize) {
    lVar9 = 0;
    do {
      pVVar7 = pMan->pAig->vObjs;
      if (pVVar7 == (Vec_Ptr_t *)0x0) {
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        uVar2 = vCut2->pArray[lVar9];
        if (((int)uVar2 < 0) || (pVVar7->nSize <= (int)uVar2)) goto LAB_00931096;
        pObj = (Aig_Obj_t *)pVVar7->pArray[uVar2];
      }
      Llb_ManGroupMarkNodes_rec(pMan->pAig,pObj);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vCut2->nSize);
  }
  iVar5 = vCut1->nSize;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      pVVar7 = pMan->pAig->vObjs;
      if (pVVar7 == (Vec_Ptr_t *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        uVar2 = vCut1->pArray[lVar9];
        if (((int)uVar2 < 0) || (pVVar7->nSize <= (int)uVar2)) {
LAB_00931096:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar8 = pVVar7->pArray[uVar2];
      }
      if (*(int *)((long)pvVar8 + 0x20) == pMan->pAig->nTravIds) {
        pVVar7 = pGroup->vIns;
        uVar2 = pVVar7->nSize;
        if (uVar2 == pVVar7->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = 0x10;
          }
          else {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar6 = pVVar7->pArray;
        }
        iVar5 = pVVar7->nSize;
        pVVar7->nSize = iVar5 + 1;
        ppvVar6[iVar5] = pvVar8;
        iVar5 = vCut1->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  if (pGroup->vNodes != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNodes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                  ,0x152,
                  "Llb_Grp_t *Llb_ManGroupCreateFromCuts(Llb_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  pVVar7 = Llb_ManGroupCollect(pGroup);
  pGroup->vNodes = pVVar7;
  return pGroup;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFromCuts( Llb_Man_t * pMan, Vec_Int_t * vCut1, Vec_Int_t * vCut2 )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );

    // mark Cut1
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        Aig_ObjSetTravIdCurrent( pMan->pAig, pObj );
    // collect unmarked Cut2
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vOuts, pObj );

    // mark nodes reachable from Cut2
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        Llb_ManGroupMarkNodes_rec( pMan->pAig, pObj );
    // collect marked Cut1
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vIns, pObj );

    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}